

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

KinDynComputations * __thiscall
iDynTree::KinDynComputations::operator=(KinDynComputations *this,KinDynComputations *other)

{
  return this;
}

Assistant:

KinDynComputations& KinDynComputations::operator=(const KinDynComputations& other)
{
    /*
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
    */
    // copyng the class is disable until we get rid of the legacy implementation
    assert(false);

    return *this;
}